

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int main(int argc,char **argv)

{
  rule **pprVar1;
  symbol **ppsVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ushort **ppuVar7;
  rule *prVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  char *pcVar12;
  lemon local_248;
  undefined8 local_128 [33];
  
  OptInit(argv,main::options,(FILE *)_stderr);
  if (main::version != 0) {
    puts("Lemon version 1.0");
    local_248.errorcnt = 0;
LAB_001045f7:
    exit(local_248.errorcnt);
  }
  iVar4 = OptNArgs();
  if (iVar4 != 1) {
    pcVar12 = "Exactly one filename argument is required.\n";
    sVar11 = 0x2b;
LAB_0010460b:
    fwrite(pcVar12,sVar11,1,_stderr);
    exit(1);
  }
  pcVar12 = (char *)0x0;
  memset(&local_248,0,0x118);
  Strsafe_init();
  Symbol_init();
  State_init();
  local_248.argv0 = *argv;
  uVar5 = argindex(0);
  if (-1 < (int)uVar5) {
    pcVar12 = g_argv[uVar5];
  }
  local_248.basisflag = main::basisflag;
  local_248.nolinenosflag = main::nolinenosflag;
  local_248.printPreprocessed = main::printPP;
  local_248.filename = pcVar12;
  Symbol_new("$");
  Parse(&local_248);
  if (local_248.printPreprocessed != 0 || local_248.errorcnt != 0) goto LAB_001045f7;
  if (local_248.nrule == 0) {
    pcVar12 = "Empty grammar.\n";
    sVar11 = 0xf;
    goto LAB_0010460b;
  }
  local_248.errsym = Symbol_find("error");
  Symbol_new("{default}");
  local_248.nsymbol = 0;
  if (x2a != (s_x2 *)0x0) {
    local_248.nsymbol = x2a->count;
  }
  local_248.symbols = Symbol_arrayof();
  sVar11 = (size_t)local_248.nsymbol;
  if (0 < (long)sVar11) {
    sVar9 = 0;
    do {
      local_248.symbols[sVar9]->index = (int)sVar9;
      sVar9 = sVar9 + 1;
    } while (sVar11 != sVar9);
  }
  qsort(local_248.symbols,sVar11,8,Symbolcmpp);
  ppsVar2 = local_248.symbols;
  lVar6 = (long)local_248.nsymbol;
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  else {
    lVar10 = 0;
    do {
      local_248.symbols[lVar10]->index = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar6 != lVar10);
  }
  do {
    lVar10 = lVar6 + -1;
    lVar6 = lVar6 + -1;
  } while (local_248.symbols[lVar10]->type == MULTITERMINAL);
  local_248.nsymbol = (int)lVar6;
  ppuVar7 = __ctype_b_loc();
  lVar6 = 0;
  do {
    lVar10 = lVar6 + 1;
    lVar6 = lVar6 + 1;
  } while ((*(byte *)((long)*ppuVar7 + (ulong)(byte)*ppsVar2[lVar10]->name * 2 + 1) & 1) != 0);
  local_248.nterminal = (int)lVar6;
  if (local_248.rule == (rule *)0x0) {
    local_248.nruleWithAction = 0;
  }
  else {
    prVar8 = local_248.rule;
    uVar5 = 0;
    do {
      pprVar1 = &prVar8->next;
      local_248.nruleWithAction = (uVar5 + 1) - (uint)(prVar8->code == (char *)0x0);
      prVar8->iRule = -(uint)(prVar8->code == (char *)0x0) | uVar5;
      prVar8 = *pprVar1;
      uVar5 = local_248.nruleWithAction;
    } while (*pprVar1 != (rule *)0x0);
    prVar8 = local_248.rule;
    if (local_248.rule != (rule *)0x0) {
      do {
        if (prVar8->iRule < 0) {
          prVar8->iRule = uVar5;
          uVar5 = uVar5 + 1;
        }
        pprVar1 = &prVar8->next;
        prVar8 = *pprVar1;
      } while (*pprVar1 != (rule *)0x0);
      local_248.startRule = local_248.rule;
      memset(local_128,0,0x100);
      while (local_248.rule != (rule *)0x0) {
        prVar8 = (local_248.rule)->next;
        (local_248.rule)->next = (rule *)0x0;
        lVar6 = 0;
        do {
          if ((rule *)local_128[lVar6] == (rule *)0x0) goto LAB_00104a37;
          local_248.rule = Rule_merge((rule *)local_128[lVar6],local_248.rule);
          local_128[lVar6] = 0;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        lVar6 = 0x20;
LAB_00104a37:
        local_128[lVar6] = local_248.rule;
        local_248.rule = prVar8;
      }
      goto LAB_0010474e;
    }
  }
  local_248.startRule = local_248.rule;
  memset(local_128,0,0x100);
LAB_0010474e:
  lVar6 = 0;
  prVar8 = (rule *)0x0;
  do {
    prVar8 = Rule_merge((rule *)local_128[lVar6],prVar8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  local_248.rule = prVar8;
  if (main::rpflag == 0) {
    size = local_248.nterminal + 2;
    FindRulePrecedences(&local_248);
    FindFirstSets(&local_248);
    local_248.nstate = 0;
    FindStates(&local_248);
    local_248.sorted = State_arrayof();
    FindLinks(&local_248);
    FindFollowSets(&local_248);
    FindActions(&local_248);
    if (main::compress == 0) {
      CompressTables(&local_248);
    }
    if (main::noResort == 0) {
      ResortStates(&local_248);
    }
    if (main::quiet == 0) {
      ReportOutput(&local_248);
    }
    ReportTable(&local_248,main::mhflag,main::sqlFlag);
    if (main::mhflag == 0) {
      ReportHeader(&local_248);
    }
  }
  else {
    Reprint(&local_248);
  }
  if (main::statistics != 0) {
    puts("Parser statistics:");
    printf("  %s%.*s %5d\n","terminal symbols",0x13,"................................",
           (ulong)(uint)local_248.nterminal);
    printf("  %s%.*s %5d\n","non-terminal symbols",0xf,"................................",
           (ulong)(uint)(local_248.nsymbol - local_248.nterminal));
    printf("  %s%.*s %5d\n","total symbols",0x16,"................................",
           (ulong)(uint)local_248.nsymbol);
    printf("  %s%.*s %5d\n","rules",0x1e,"................................",
           (ulong)(uint)local_248.nrule);
    printf("  %s%.*s %5d\n","states",0x1d,"................................",
           (ulong)(uint)local_248.nxstate);
    printf("  %s%.*s %5d\n","conflicts",0x1a,"................................",
           (ulong)(uint)local_248.nconflict);
    printf("  %s%.*s %5d\n","action table entries",0xf,"................................",
           (ulong)(uint)local_248.nactiontab);
    printf("  %s%.*s %5d\n","lookahead table entries",0xc,"................................",
           (ulong)(uint)local_248.nlookaheadtab);
    printf("  %s%.*s %5d\n","total table size (bytes)",0xb,"................................",
           (ulong)(uint)local_248.tablesize);
  }
  if (local_248.nconflict < 1) {
    bVar3 = false;
  }
  else {
    fprintf(_stderr,"%d parsing conflicts.\n");
    bVar3 = 0 < local_248.nconflict;
  }
  exit((uint)(byte)(0 < local_248.errorcnt | bVar3));
}

Assistant:

int main(int argc, char **argv)
{
  static int version = 0;
  static int rpflag = 0;
  static int basisflag = 0;
  static int compress = 0;
  static int quiet = 0;
  static int statistics = 0;
  static int mhflag = 0;
  static int nolinenosflag = 0;
  static int noResort = 0;
  static int sqlFlag = 0;
  static int printPP = 0;
  
  static struct s_options options[] = {
    {OPT_FLAG, "b", (char*)&basisflag, "Print only the basis in report."},
    {OPT_FLAG, "c", (char*)&compress, "Don't compress the action table."},
    {OPT_FSTR, "d", (char*)&handle_d_option, "Output directory.  Default '.'"},
    {OPT_FSTR, "D", (char*)handle_D_option, "Define an %ifdef macro."},
    {OPT_FLAG, "E", (char*)&printPP, "Print input file after preprocessing."},
    {OPT_FSTR, "f", 0, "Ignored.  (Placeholder for -f compiler options.)"},
    {OPT_FLAG, "g", (char*)&rpflag, "Print grammar without actions."},
    {OPT_FSTR, "I", 0, "Ignored.  (Placeholder for '-I' compiler options.)"},
    {OPT_FLAG, "m", (char*)&mhflag, "Output a makeheaders compatible file."},
    {OPT_FLAG, "l", (char*)&nolinenosflag, "Do not print #line statements."},
    {OPT_FSTR, "O", 0, "Ignored.  (Placeholder for '-O' compiler options.)"},
    {OPT_FLAG, "p", (char*)&showPrecedenceConflict,
                    "Show conflicts resolved by precedence rules"},
    {OPT_FLAG, "q", (char*)&quiet, "(Quiet) Don't print the report file."},
    {OPT_FLAG, "r", (char*)&noResort, "Do not sort or renumber states"},
    {OPT_FLAG, "s", (char*)&statistics,
                                   "Print parser stats to standard output."},
    {OPT_FLAG, "S", (char*)&sqlFlag,
                    "Generate the *.sql file describing the parser tables."},
    {OPT_FLAG, "x", (char*)&version, "Print the version number."},
    {OPT_FSTR, "T", (char*)handle_T_option, "Specify a template file."},
    {OPT_FSTR, "W", 0, "Ignored.  (Placeholder for '-W' compiler options.)"},
    {OPT_FLAG,0,0,0}
  };
  int i;
  int exitcode;
  struct lemon lem;
  struct rule *rp;

  OptInit(argv,options,stderr);
  if( version ){
     printf("Lemon version 1.0\n");
     exit(0);
  }
  if( OptNArgs()!=1 ){
    fprintf(stderr,"Exactly one filename argument is required.\n");
    exit(1);
  }
  memset(&lem, 0, sizeof(lem));
  lem.errorcnt = 0;

  /* Initialize the machine */
  Strsafe_init();
  Symbol_init();
  State_init();
  lem.argv0 = argv[0];
  lem.filename = OptArg(0);
  lem.basisflag = basisflag;
  lem.nolinenosflag = nolinenosflag;
  lem.printPreprocessed = printPP;
  Symbol_new("$");

  /* Parse the input file */
  Parse(&lem);
  if( lem.printPreprocessed || lem.errorcnt ) exit(lem.errorcnt);
  if( lem.nrule==0 ){
    fprintf(stderr,"Empty grammar.\n");
    exit(1);
  }
  lem.errsym = Symbol_find("error");

  /* Count and index the symbols of the grammar */
  Symbol_new("{default}");
  lem.nsymbol = Symbol_count();
  lem.symbols = Symbol_arrayof();
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  qsort(lem.symbols,lem.nsymbol,sizeof(struct symbol*), Symbolcmpp);
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  while( lem.symbols[i-1]->type==MULTITERMINAL ){ i--; }
  assert( strcmp(lem.symbols[i-1]->name,"{default}")==0 );
  lem.nsymbol = i - 1;
  for(i=1; ISUPPER(lem.symbols[i]->name[0]); i++);
  lem.nterminal = i;

  /* Assign sequential rule numbers.  Start with 0.  Put rules that have no
  ** reduce action C-code associated with them last, so that the switch()
  ** statement that selects reduction actions will have a smaller jump table.
  */
  for(i=0, rp=lem.rule; rp; rp=rp->next){
    rp->iRule = rp->code ? i++ : -1;
  }
  lem.nruleWithAction = i;
  for(rp=lem.rule; rp; rp=rp->next){
    if( rp->iRule<0 ) rp->iRule = i++;
  }
  lem.startRule = lem.rule;
  lem.rule = Rule_sort(lem.rule);

  /* Generate a reprint of the grammar, if requested on the command line */
  if( rpflag ){
    Reprint(&lem);
  }else{
    /* Initialize the size for all follow and first sets */
    SetSize(lem.nterminal+1);

    /* Find the precedence for every production rule (that has one) */
    FindRulePrecedences(&lem);

    /* Compute the lambda-nonterminals and the first-sets for every
    ** nonterminal */
    FindFirstSets(&lem);

    /* Compute all LR(0) states.  Also record follow-set propagation
    ** links so that the follow-set can be computed later */
    lem.nstate = 0;
    FindStates(&lem);
    lem.sorted = State_arrayof();

    /* Tie up loose ends on the propagation links */
    FindLinks(&lem);

    /* Compute the follow set of every reducible configuration */
    FindFollowSets(&lem);

    /* Compute the action tables */
    FindActions(&lem);

    /* Compress the action tables */
    if( compress==0 ) CompressTables(&lem);

    /* Reorder and renumber the states so that states with fewer choices
    ** occur at the end.  This is an optimization that helps make the
    ** generated parser tables smaller. */
    if( noResort==0 ) ResortStates(&lem);

    /* Generate a report of the parser generated.  (the "y.output" file) */
    if( !quiet ) ReportOutput(&lem);

    /* Generate the source code for the parser */
    ReportTable(&lem, mhflag, sqlFlag);

    /* Produce a header file for use by the scanner.  (This step is
    ** omitted if the "-m" option is used because makeheaders will
    ** generate the file for us.) */
    if( !mhflag ) ReportHeader(&lem);
  }
  if( statistics ){
    printf("Parser statistics:\n");
    stats_line("terminal symbols", lem.nterminal);
    stats_line("non-terminal symbols", lem.nsymbol - lem.nterminal);
    stats_line("total symbols", lem.nsymbol);
    stats_line("rules", lem.nrule);
    stats_line("states", lem.nxstate);
    stats_line("conflicts", lem.nconflict);
    stats_line("action table entries", lem.nactiontab);
    stats_line("lookahead table entries", lem.nlookaheadtab);
    stats_line("total table size (bytes)", lem.tablesize);
  }
  if( lem.nconflict > 0 ){
    fprintf(stderr,"%d parsing conflicts.\n",lem.nconflict);
  }

  /* return 0 on success, 1 on failure. */
  exitcode = ((lem.errorcnt > 0) || (lem.nconflict > 0)) ? 1 : 0;
  exit(exitcode);
  return (exitcode);
}